

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  WhereMaskSet *in_RSI;
  WhereMaskSet *in_RDI;
  Bitmask mask;
  Expr *local_28;
  Expr *local_8;
  
  if (((char)in_RSI->bVarSelect == -0x62) && ((in_RSI->n & 8U) == 0)) {
    local_8 = (Expr *)sqlite3WhereGetMask(in_RDI,in_RSI->ix[9]);
  }
  else if ((in_RSI->n & 0x804000U) == 0) {
    if ((char)in_RSI->bVarSelect == -0x59) {
      local_28 = (Expr *)sqlite3WhereGetMask(in_RDI,in_RSI->ix[9]);
    }
    else {
      local_28 = (Expr *)0x0;
    }
    if (*(long *)(in_RSI->ix + 2) != 0) {
      BVar1 = sqlite3WhereExprUsageNN(in_RSI,local_28);
      local_28 = (Expr *)(BVar1 | (ulong)local_28);
    }
    if (*(long *)(in_RSI->ix + 4) == 0) {
      if ((in_RSI->n & 0x800U) == 0) {
        local_8 = local_28;
        if (*(long *)(in_RSI->ix + 6) != 0) {
          BVar1 = sqlite3WhereExprListUsage(in_RDI,(ExprList *)in_RSI);
          local_8 = (Expr *)(BVar1 | (ulong)local_28);
        }
      }
      else {
        if ((in_RSI->n & 0x20U) != 0) {
          in_RDI->bVarSelect = 1;
        }
        BVar1 = exprSelectUsage(in_RDI,(Select *)in_RSI);
        local_8 = (Expr *)(BVar1 | (ulong)local_28);
      }
    }
    else {
      BVar1 = sqlite3WhereExprUsageNN(in_RSI,local_28);
      local_8 = (Expr *)(BVar1 | (ulong)local_28);
    }
  }
  else {
    local_8 = (Expr *)0x0;
  }
  return (Bitmask)local_8;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
  return mask;
}